

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

bool __thiscall QGles2GraphicsPipeline::create(QGles2GraphicsPipeline *this)

{
  qint64 *pqVar1;
  uint *puVar2;
  QRhiGles2 *this_00;
  void *pvVar3;
  qsizetype qVar4;
  Data *pDVar5;
  SeparateToCombinedImageSamplerMapping *pSVar6;
  qsizetype qVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  GLuint GVar11;
  ProgramCacheResult PVar12;
  ulong uVar13;
  iterator ub;
  iterator iVar14;
  iterator iVar15;
  iterator iVar16;
  iterator mapping;
  iterator iVar17;
  GLchar *pGVar18;
  char *pcVar19;
  uint *puVar20;
  QRhiGles2 *this_01;
  QRhiShaderStage *shaderStage_1;
  QRhiShaderStage *pQVar21;
  QRhiShaderStage *shaderStage;
  long lVar22;
  long lVar23;
  bool bVar24;
  InOutVariable *inVar;
  long in_FS_OFFSET;
  QRhiShaderStage *shaderStage_2;
  QRhiResource *copy;
  QShaderVersion shaderVersion;
  QShader shader;
  ActiveUniformLocationTracker activeUniformLocations;
  SeparateToCombinedImageSamplerMappingList samplerMappingList [5];
  QArrayDataPointer<QShaderDescription::InOutVariable> local_5c0;
  QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping> local_5a8;
  QShaderVersion local_588;
  QShader local_580;
  undefined1 local_578 [1088];
  _Hashtable<int,_int,_std::pmr::polymorphic_allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_QDuplicateTracker<int,_32UL>::QHasher<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_138;
  Blend local_e8;
  Blend BStack_d0;
  Blend local_b8;
  Blend BStack_a0;
  Blend local_88;
  QShaderDescription local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QShaderDescription local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRhiGles2 *)(this->super_QRhiGraphicsPipeline).super_QRhiResource.m_rhi;
  if (this->program != 0) {
    (*(this->super_QRhiGraphicsPipeline).super_QRhiResource._vptr_QRhiResource[3])(this);
  }
  bVar24 = false;
  bVar9 = QRhiGles2::ensureContext(this_00,(QSurface *)0x0);
  if (!bVar9) goto LAB_0057fde3;
  QElapsedTimer::start();
  bVar9 = QRhiImplementation::sanityCheckGraphicsPipeline
                    ((QRhiImplementation *)this_00,&this->super_QRhiGraphicsPipeline);
  if (!bVar9) {
    bVar24 = false;
    goto LAB_0057fde3;
  }
  this->drawMode =
       *(GLenum *)(&DAT_006c6ad8 + (long)(int)(this->super_QRhiGraphicsPipeline).m_topology * 4);
  GVar11 = (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
             functions[0x3f])();
  this->program = GVar11;
  local_68.d = (QShaderDescriptionPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48[0].d = (QShaderDescriptionPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  lVar22 = 0;
  do {
    QShaderDescription::QShaderDescription((QShaderDescription *)((long)&local_68.d + lVar22));
    lVar22 = lVar22 + 8;
  } while (lVar22 != 0x28);
  local_e8.srcColor = 0;
  local_e8.dstColor = 0;
  local_e8.srcAlpha = 0;
  local_e8.dstAlpha = 0;
  local_e8.opColor = 0;
  local_e8.opAlpha = 0;
  BStack_d0.srcColor = 0;
  BStack_d0.dstColor = 0;
  BStack_d0.srcAlpha = 0;
  BStack_d0.dstAlpha = 0;
  BStack_d0.opColor = 0;
  BStack_d0.opAlpha = 0;
  local_b8.srcColor = 0;
  local_b8.dstColor = 0;
  local_b8.srcAlpha = 0;
  local_b8.dstAlpha = 0;
  local_b8.opColor = 0;
  local_b8.opAlpha = 0;
  BStack_a0.srcColor = 0;
  BStack_a0.dstColor = 0;
  BStack_a0.srcAlpha = 0;
  BStack_a0.dstAlpha = 0;
  BStack_a0.opColor = 0;
  BStack_a0.opAlpha = 0;
  local_88.srcColor = 0;
  local_88.dstColor = 0;
  local_88.srcAlpha = 0;
  local_88.dstAlpha = 0;
  local_88.opColor = 0;
  local_88.opAlpha = 0;
  lVar22 = (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
           super_QVLABaseBase.s;
  if (lVar22 == 0) {
    bVar9 = true;
  }
  else {
    pQVar21 = (QRhiShaderStage *)
              (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
              super_QVLABaseBase.ptr;
    lVar22 = lVar22 * 0x18;
    bVar9 = true;
    do {
      uVar13 = (ulong)pQVar21->m_type;
      if (uVar13 < 5) {
        if ((pQVar21->m_type & Geometry) != Vertex) {
          bVar9 = false;
        }
        local_580.d = (QShaderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QShader::QShader(&local_580,&pQVar21->m_shader);
        local_588.m_version = 100;
        local_588.m_flags.super_QFlagsStorageHelper<QShaderVersion::Flag,_4>.
        super_QFlagsStorage<QShaderVersion::Flag>.i =
             (QFlagsStorageHelper<QShaderVersion::Flag,_4>)0x0;
        QShader::description((QShader *)local_578);
        QShaderDescription::operator=(&local_68 + uVar13,(QShaderDescription *)local_578);
        QShaderDescription::~QShaderDescription((QShaderDescription *)local_578);
        QRhiGles2::shaderSource((QByteArray *)local_578,this_00,pQVar21,&local_588);
        uVar8 = local_578._16_8_;
        if ((QArrayData *)local_578._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_578._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_578._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_578._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_578._0_8_,1,0x10);
          }
        }
        if (uVar8 != 0) {
          QShaderKey::QShaderKey
                    ((QShaderKey *)&local_5c0,GlslShader,&local_588,pQVar21->m_shaderVariant);
          QShader::separateToCombinedImageSamplerMappingList
                    ((SeparateToCombinedImageSamplerMappingList *)&local_5a8,&local_580,
                     (QShaderKey *)&local_5c0);
          qVar4 = local_5a8.size;
          pSVar6 = local_5a8.ptr;
          pDVar5 = local_5a8.d;
          local_5a8.d = (Data *)0x0;
          local_5a8.ptr = (SeparateToCombinedImageSamplerMapping *)0x0;
          local_5a8.size = 0;
          qVar7 = local_5a8.size;
          local_578._0_8_ = *(undefined8 *)(&local_e8 + uVar13);
          local_578._8_8_ = *(undefined8 *)&(&local_e8)[uVar13].srcAlpha;
          *(Data **)(&local_e8 + uVar13) = pDVar5;
          *(SeparateToCombinedImageSamplerMapping **)&(&local_e8)[uVar13].srcAlpha = pSVar6;
          local_578._16_4_ = (&local_e8)[uVar13].opColor;
          local_578._20_4_ = (&local_e8)[uVar13].opAlpha;
          local_5a8.size._0_4_ = (undefined4)qVar4;
          local_5a8.size._4_4_ = SUB84(qVar4,4);
          (&local_e8)[uVar13].opColor = (undefined4)local_5a8.size;
          (&local_e8)[uVar13].opAlpha = local_5a8.size._4_4_;
          local_5a8.size = qVar7;
          QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>::~QArrayDataPointer
                    ((QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping> *)local_578)
          ;
          QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>::~QArrayDataPointer
                    (&local_5a8);
        }
        QShader::~QShader(&local_580);
      }
      pQVar21 = pQVar21 + 1;
      lVar22 = lVar22 + -0x18;
    } while (lVar22 != 0);
  }
  local_5a8.d = (Data *)0x0;
  local_5a8.ptr = (SeparateToCombinedImageSamplerMapping *)0x0;
  local_5a8.size = 0;
  pQVar21 = (QRhiShaderStage *)
            (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
            super_QVLABaseBase.ptr;
  qVar4 = (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
          super_QVLABaseBase.s;
  GVar11 = this->program;
  QShaderDescription::inputVariables
            ((QList<QShaderDescription::InOutVariable> *)local_578,&local_68);
  PVar12 = QRhiGles2::tryLoadFromDiskOrPipelineCache
                     (this_00,pQVar21,(int)qVar4,GVar11,
                      (QVector<QShaderDescription::InOutVariable> *)local_578,
                      (QByteArray *)&local_5a8);
  QArrayDataPointer<QShaderDescription::InOutVariable>::~QArrayDataPointer
            ((QArrayDataPointer<QShaderDescription::InOutVariable> *)local_578);
  if (PVar12 == ProgramCacheMiss) {
    lVar22 = (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
             super_QVLABaseBase.s;
    if (lVar22 != 0) {
      pQVar21 = (QRhiShaderStage *)
                (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
                super_QVLABaseBase.ptr;
      lVar22 = lVar22 * 0x18;
      do {
        if (pQVar21->m_type < Compute) {
          bVar24 = false;
          bVar10 = QRhiGles2::compileShader(this_00,this->program,pQVar21,(QShaderVersion *)0x0);
          if (!bVar10) goto LAB_0057fd82;
        }
        pQVar21 = pQVar21 + 1;
        lVar22 = lVar22 + -0x18;
      } while (lVar22 != 0);
    }
    QShaderDescription::inputVariables
              ((QList<QShaderDescription::InOutVariable> *)local_578,&local_68);
    iVar15 = QList<QShaderDescription::InOutVariable>::begin
                       ((QList<QShaderDescription::InOutVariable> *)local_578);
    iVar16 = QList<QShaderDescription::InOutVariable>::end
                       ((QList<QShaderDescription::InOutVariable> *)local_578);
    for (; iVar15.i != iVar16.i; iVar15.i = iVar15.i + 1) {
      pcVar19 = ((iVar15.i)->name).d.ptr;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = (char *)&QByteArray::_empty;
      }
      (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
        functions[0x31])((ulong)this->program,(ulong)(uint)(iVar15.i)->location,pcVar19);
    }
    this_01 = (QRhiGles2 *)local_578;
    QArrayDataPointer<QShaderDescription::InOutVariable>::~QArrayDataPointer
              ((QArrayDataPointer<QShaderDescription::InOutVariable> *)this_01);
    if (bVar9) {
      QRhiGles2::sanityCheckVertexFragmentInterface(this_01,&local_68,local_48);
    }
    bVar9 = QRhiGles2::linkProgram(this_00,this->program);
    if (bVar9) {
      if (((this_00->rhiFlags).super_QFlagsStorageHelper<QRhi::Flag,_4>.
           super_QFlagsStorage<QRhi::Flag>.i & 4) != 0) {
        QRhiGles2::trySaveToPipelineCache(this_00,this->program,(QByteArray *)&local_5a8,true);
      }
      QRhiGles2::trySaveToDiskCache(this_00,this->program,(QByteArray *)&local_5a8);
      goto LAB_0057fa98;
    }
LAB_0057fcb9:
    bVar24 = false;
  }
  else {
    if (PVar12 == ProgramCacheError) goto LAB_0057fcb9;
    if (((this_00->rhiFlags).super_QFlagsStorageHelper<QRhi::Flag,_4>.
         super_QFlagsStorage<QRhi::Flag>.i & 4) != 0) {
      QRhiGles2::trySaveToPipelineCache(this_00,this->program,(QByteArray *)&local_5a8,false);
    }
LAB_0057fa98:
    memcpy((QDuplicateTracker<int,_32UL> *)local_578,&DAT_006c64e0,0x488);
    QDuplicateTracker<int,_32UL>::QDuplicateTracker((QDuplicateTracker<int,_32UL> *)local_578);
    lVar22 = (this->super_QRhiGraphicsPipeline).m_shaderStages.super_QVLABase<QRhiShaderStage>.
             super_QVLABaseBase.s;
    if (lVar22 != 0) {
      puVar20 = (uint *)(this->super_QRhiGraphicsPipeline).m_shaderStages.
                        super_QVLABase<QRhiShaderStage>.super_QVLABaseBase.ptr;
      puVar2 = puVar20 + lVar22 * 6;
      do {
        uVar13 = (ulong)*puVar20;
        if (uVar13 < 5) {
          QShaderDescription::uniformBlocks
                    ((QList<QShaderDescription::UniformBlock> *)&local_5c0,&local_68 + uVar13);
          ub = QList<QShaderDescription::UniformBlock>::begin
                         ((QList<QShaderDescription::UniformBlock> *)&local_5c0);
          iVar14 = QList<QShaderDescription::UniformBlock>::end
                             ((QList<QShaderDescription::UniformBlock> *)&local_5c0);
          for (; ub.i != iVar14.i; ub.i = ub.i + 1) {
            QRhiGles2::gatherUniforms
                      (this_00,this->program,ub.i,(ActiveUniformLocationTracker *)local_578,
                       &this->uniforms);
          }
          QArrayDataPointer<QShaderDescription::UniformBlock>::~QArrayDataPointer
                    ((QArrayDataPointer<QShaderDescription::UniformBlock> *)&local_5c0);
          QShaderDescription::combinedImageSamplers
                    ((QList<QShaderDescription::InOutVariable> *)&local_5c0,&local_68 + uVar13);
          iVar15 = QList<QShaderDescription::InOutVariable>::begin
                             ((QList<QShaderDescription::InOutVariable> *)&local_5c0);
          iVar16 = QList<QShaderDescription::InOutVariable>::end
                             ((QList<QShaderDescription::InOutVariable> *)&local_5c0);
          for (; iVar15.i != iVar16.i; iVar15.i = iVar15.i + 1) {
            QRhiGles2::gatherSamplers(this_00,this->program,iVar15.i,&this->samplers);
          }
          QArrayDataPointer<QShaderDescription::InOutVariable>::~QArrayDataPointer(&local_5c0);
          mapping = QList<QShader::SeparateToCombinedImageSamplerMapping>::begin
                              ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)
                               (&local_e8 + uVar13));
          iVar17 = QList<QShader::SeparateToCombinedImageSamplerMapping>::end
                             ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)
                              (&local_e8 + uVar13));
          for (; mapping.i != iVar17.i; mapping.i = mapping.i + 1) {
            QRhiGles2::gatherGeneratedSamplers(this_00,this->program,mapping.i,&this->samplers);
          }
        }
        puVar20 = puVar20 + 6;
      } while (puVar20 != puVar2);
    }
    uVar13 = (this->uniforms).super_QVLABase<QGles2UniformDescription>.super_QVLABaseBase.s;
    if (uVar13 != 0) {
      pvVar3 = (this->uniforms).super_QVLABase<QGles2UniformDescription>.super_QVLABaseBase.ptr;
      lVar22 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      std::
      __introsort_loop<QGles2UniformDescription*,long,__gnu_cxx::__ops::_Iter_comp_iter<QGles2GraphicsPipeline::create()::__1>>
                (pvVar3,(void *)((long)pvVar3 + uVar13 * 0x18),((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)uVar13 < 0x11) {
        std::
        __insertion_sort<QGles2UniformDescription*,__gnu_cxx::__ops::_Iter_comp_iter<QGles2GraphicsPipeline::create()::__1>>
                  (pvVar3);
      }
      else {
        lVar22 = (long)pvVar3 + 0x180;
        std::
        __insertion_sort<QGles2UniformDescription*,__gnu_cxx::__ops::_Iter_comp_iter<QGles2GraphicsPipeline::create()::__1>>
                  (pvVar3);
        lVar23 = uVar13 * 0x18 + -0x180;
        do {
          std::
          __unguarded_linear_insert<QGles2UniformDescription*,__gnu_cxx::__ops::_Val_comp_iter<QGles2GraphicsPipeline::create()::__1>>
                    (lVar22);
          lVar22 = lVar22 + 0x18;
          lVar23 = lVar23 + -0x18;
        } while (lVar23 != 0);
      }
    }
    memset(this->uniformState,0,0x5000);
    this->currentSrb = (QRhiShaderResourceBindings *)0x0;
    this->currentSrbGeneration = 0;
    if (this_00->glObjectLabel != (_func_void_GLenum_GLuint_GLsizei_GLchar_ptr *)0x0) {
      pGVar18 = (this->super_QRhiGraphicsPipeline).super_QRhiResource.m_objectName.d.ptr;
      if (pGVar18 == (GLchar *)0x0) {
        pGVar18 = (GLchar *)&QByteArray::_empty;
      }
      (*this_00->glObjectLabel)(0x82e2,this->program,-1,pGVar18);
    }
    lVar22 = QElapsedTimer::elapsed();
    pqVar1 = &(this_00->super_QRhiImplementation).accumulatedPipelineCreationTime;
    *pqVar1 = *pqVar1 + lVar22;
    this->generation = this->generation + 1;
    local_580.d._0_1_ = 1;
    local_5c0.d = (Data *)this;
    QHash<QRhiResource*,bool>::emplace<bool_const&>
              ((QHash<QRhiResource*,bool> *)&(this_00->super_QRhiImplementation).resources,
               (QRhiResource **)&local_5c0,(bool *)&local_580);
    std::
    _Hashtable<int,_int,_std::pmr::polymorphic_allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_QDuplicateTracker<int,_32UL>::QHasher<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_138);
    std::pmr::monotonic_buffer_resource::~monotonic_buffer_resource
              ((monotonic_buffer_resource *)(local_578 + 0x400));
    bVar24 = true;
  }
LAB_0057fd82:
  if (&(local_5a8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_5a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_5a8.d)->super_QArrayData,1,0x10);
    }
  }
  lVar22 = 0x60;
  do {
    QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping>::~QArrayDataPointer
              ((QArrayDataPointer<QShader::SeparateToCombinedImageSamplerMapping> *)
               ((long)&local_e8.srcColor + lVar22));
    lVar22 = lVar22 + -0x18;
  } while (lVar22 != -0x18);
  lVar22 = 0x20;
  do {
    QShaderDescription::~QShaderDescription((QShaderDescription *)((long)&local_68.d + lVar22));
    lVar22 = lVar22 + -8;
  } while (lVar22 != -8);
LAB_0057fde3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar24;
}

Assistant:

bool QGles2GraphicsPipeline::create()
{
    QRHI_RES_RHI(QRhiGles2);

    if (program)
        destroy();

    if (!rhiD->ensureContext())
        return false;

    rhiD->pipelineCreationStart();
    if (!rhiD->sanityCheckGraphicsPipeline(this))
        return false;

    drawMode = toGlTopology(m_topology);

    program = rhiD->f->glCreateProgram();

    enum {
        VtxIdx = 0,
        TCIdx,
        TEIdx,
        GeomIdx,
        FragIdx,
        LastIdx
    };
    const auto descIdxForStage = [](const QRhiShaderStage &shaderStage) {
        switch (shaderStage.type()) {
        case QRhiShaderStage::Vertex:
            return VtxIdx;
        case QRhiShaderStage::TessellationControl:
            return TCIdx;
        case QRhiShaderStage::TessellationEvaluation:
            return TEIdx;
        case QRhiShaderStage::Geometry:
            return GeomIdx;
        case QRhiShaderStage::Fragment:
            return FragIdx;
        default:
            break;
        }
        Q_UNREACHABLE_RETURN(VtxIdx);
    };
    QShaderDescription desc[LastIdx];
    QShader::SeparateToCombinedImageSamplerMappingList samplerMappingList[LastIdx];
    bool vertexFragmentOnly = true;
    for (const QRhiShaderStage &shaderStage : std::as_const(m_shaderStages)) {
        if (isGraphicsStage(shaderStage)) {
            const int idx = descIdxForStage(shaderStage);
            if (idx != VtxIdx && idx != FragIdx)
                vertexFragmentOnly = false;
            QShader shader = shaderStage.shader();
            QShaderVersion shaderVersion;
            desc[idx] = shader.description();
            if (!rhiD->shaderSource(shaderStage, &shaderVersion).isEmpty()) {
                samplerMappingList[idx] = shader.separateToCombinedImageSamplerMappingList(
                            { QShader::GlslShader, shaderVersion, shaderStage.shaderVariant() });
            }
        }
    }

    QByteArray cacheKey;
    QRhiGles2::ProgramCacheResult cacheResult = rhiD->tryLoadFromDiskOrPipelineCache(m_shaderStages.constData(),
                                                                                     m_shaderStages.size(),
                                                                                     program,
                                                                                     desc[VtxIdx].inputVariables(),
                                                                                     &cacheKey);
    if (cacheResult == QRhiGles2::ProgramCacheError)
        return false;

    if (cacheResult == QRhiGles2::ProgramCacheMiss) {
        for (const QRhiShaderStage &shaderStage : std::as_const(m_shaderStages)) {
            if (isGraphicsStage(shaderStage)) {
                if (!rhiD->compileShader(program, shaderStage, nullptr))
                    return false;
            }
        }

        // important when GLSL <= 150 is used that does not have location qualifiers
        for (const QShaderDescription::InOutVariable &inVar : desc[VtxIdx].inputVariables())
            rhiD->f->glBindAttribLocation(program, GLuint(inVar.location), inVar.name);

        if (vertexFragmentOnly)
            rhiD->sanityCheckVertexFragmentInterface(desc[VtxIdx], desc[FragIdx]);

        if (!rhiD->linkProgram(program))
            return false;

        if (rhiD->rhiFlags.testFlag(QRhi::EnablePipelineCacheDataSave)) {
            // force replacing existing cache entry (if there is one, then
            // something is wrong with it, as there was no hit)
            rhiD->trySaveToPipelineCache(program, cacheKey, true);
        }
        // legacy QOpenGLShaderProgram style behavior: do this always, even
        // though it is superfluous with the "pipeline cache" enabled. Continue
        // storing to the Qt 5 style individual-file disk cache, because there
        // is no guarantee one retrieves the "pipeline cache" blob and writes it
        // out. Classic example: if Qt Quick only retrieves and stores the
        // combined cache contents when exiting, applications that never exit
        // cleanly (because they are killed, Ctrl+C'd, etc.) never store any
        // program binaries! Therefore, to maintain Qt 5 behavioral
        // compatibility, continue writing out the individual files no matter
        // what.
        rhiD->trySaveToDiskCache(program, cacheKey);
    } else {
        Q_ASSERT(cacheResult == QRhiGles2::ProgramCacheHit);
        if (rhiD->rhiFlags.testFlag(QRhi::EnablePipelineCacheDataSave)) {
            // just so that it ends up in the pipeline cache also when the hit was
            // from the disk cache
            rhiD->trySaveToPipelineCache(program, cacheKey);
        }
    }

    // Use the same work area for the vertex & fragment stages, thus ensuring
    // that we will not do superfluous glUniform calls for uniforms that are
    // present in both shaders.
    QRhiGles2::ActiveUniformLocationTracker activeUniformLocations;

    for (const QRhiShaderStage &shaderStage : std::as_const(m_shaderStages)) {
        if (isGraphicsStage(shaderStage)) {
            const int idx = descIdxForStage(shaderStage);
            for (const QShaderDescription::UniformBlock &ub : desc[idx].uniformBlocks())
                rhiD->gatherUniforms(program, ub, &activeUniformLocations, &uniforms);
            for (const QShaderDescription::InOutVariable &v : desc[idx].combinedImageSamplers())
                rhiD->gatherSamplers(program, v, &samplers);
            for (const QShader::SeparateToCombinedImageSamplerMapping &mapping : samplerMappingList[idx])
                rhiD->gatherGeneratedSamplers(program, mapping, &samplers);
        }
    }

    std::sort(uniforms.begin(), uniforms.end(),
              [](const QGles2UniformDescription &a, const QGles2UniformDescription &b)
    {
        return a.offset < b.offset;
    });

    memset(uniformState, 0, sizeof(uniformState));

    currentSrb = nullptr;
    currentSrbGeneration = 0;

    if (rhiD->glObjectLabel)
        rhiD->glObjectLabel(GL_PROGRAM, program, -1, m_objectName.constData());

    rhiD->pipelineCreationEnd();
    generation += 1;
    rhiD->registerResource(this);
    return true;
}